

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

void __thiscall ctemplate::TemplateDictionary::Dump(TemplateDictionary *this,int indent)

{
  string out;
  undefined1 *local_30;
  size_t local_28;
  undefined1 local_20 [16];
  
  local_28 = 0;
  local_20[0] = 0;
  local_30 = local_20;
  (*(this->super_TemplateDictionaryInterface)._vptr_TemplateDictionaryInterface[4])
            (this,&local_30,indent);
  fwrite(local_30,1,local_28,_stdout);
  fflush(_stdout);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

void TemplateDictionary::Dump(int indent) const {
  string out;
  DumpToString(&out, indent);
  fwrite(out.data(), 1, out.length(), stdout);
  fflush(stdout);
}